

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strncmp(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 nLen;
  sxi32 iValue;
  char *zLeft;
  char *zRight;
  int n;
  int res;
  char *z2;
  char *z1;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 3) {
    pCtx_local._4_4_ = jx9Builtin_strcmp(pCtx,nArg,apArg);
  }
  else {
    nLen = jx9_value_to_int(apArg[2]);
    if ((int)nLen < 0) {
      jx9_result_int(pCtx,-1);
      pCtx_local._4_4_ = 0;
    }
    else {
      zLeft = jx9_value_to_string(*apArg,(int *)0x0);
      zRight = jx9_value_to_string(apArg[1],(int *)0x0);
      iValue = SyStrncmp(zLeft,zRight,nLen);
      jx9_result_int(pCtx,iValue);
      pCtx_local._4_4_ = 0;
    }
  }
  return pCtx_local._4_4_;
}

Assistant:

static int jx9Builtin_strncmp(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *z1, *z2;
	int res;
	int n;
	if( nArg < 3 ){
		/* Perform a standard comparison */
		return jx9Builtin_strcmp(pCtx, nArg, apArg);
	}
	/* Desired comparison length */
	n  = jx9_value_to_int(apArg[2]);
	if( n < 0 ){
		/* Invalid length */
		jx9_result_int(pCtx, -1);
		return JX9_OK;
	}
	/* Perform the comparison */
	z1 = jx9_value_to_string(apArg[0], 0);
	z2 = jx9_value_to_string(apArg[1], 0);
	res = SyStrncmp(z1, z2, (sxu32)n);
	/* Comparison result */
	jx9_result_int(pCtx, res);
	return JX9_OK;
}